

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_search_facade.c
# Opt level: O3

int_mv av1_simple_motion_search_sse_var
                 (AV1_COMP *cpi,MACROBLOCK *x,int mi_row,int mi_col,BLOCK_SIZE bsize,int ref,
                 FULLPEL_MV start_mv,int num_planes,int use_subpixel,uint *sse,uint *var)

{
  uint8_t uVar1;
  MB_MODE_INFO *pMVar2;
  BLOCK_SIZE BVar3;
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  int mi_ext_col;
  int iVar4;
  int iVar5;
  int_mv iVar6;
  RefCntBuffer *pRVar7;
  scale_factors *psVar8;
  byte bVar9;
  int iVar10;
  uint uVar11;
  int *cost_list_00;
  byte bVar12;
  YV12_BUFFER_CONFIG *pYVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  undefined7 in_register_00000081;
  undefined4 in_register_0000008c;
  byte bVar17;
  byte bVar18;
  long lVar19;
  search_site_config *search_sites;
  bool bVar20;
  MV ref_mv;
  FULLPEL_MV_STATS best_mv_stats;
  int not_used;
  buf_2d backup_yv12;
  int cost_list [5];
  FULLPEL_MOTION_SEARCH_PARAMS full_ms_params;
  SUBPEL_MOTION_SEARCH_PARAMS ms_params;
  FULLPEL_MV local_264;
  ulong local_260;
  MACROBLOCKD *local_258;
  ulong local_250;
  MV local_244;
  YV12_BUFFER_CONFIG *local_240;
  undefined8 local_238;
  int local_22c;
  ulong local_228;
  ulong local_220;
  FULLPEL_MV_STATS local_214;
  AV1_COMMON *local_208;
  int local_1fc;
  uint8_t *local_1f8;
  uint8_t *puStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  int local_1d8 [8];
  FULLPEL_MOTION_SEARCH_PARAMS local_1b8;
  SUBPEL_MOTION_SEARCH_PARAMS local_d8;
  
  local_238 = CONCAT44(in_register_0000008c,ref);
  local_250 = (ulong)(uint)mi_col;
  uVar1 = ((cpi->common).seq_params)->monochrome;
  local_228 = CONCAT71(in_register_00000081,bsize) & 0xffffffff;
  bVar18 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[local_228];
  bVar12 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[local_228];
  iVar5 = (cpi->common).mi_params.mi_stride;
  iVar16 = iVar5 * mi_row + mi_col;
  iVar10 = mi_row / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                               [(cpi->common).mi_params.mi_alloc_bsize];
  iVar4 = mi_col / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                              [(cpi->common).mi_params.mi_alloc_bsize];
  (cpi->common).mi_params.mi_grid_base[iVar16] =
       (cpi->common).mi_params.mi_alloc + ((cpi->common).mi_params.mi_alloc_stride * iVar10 + iVar4)
  ;
  (x->e_mbd).mi = (cpi->common).mi_params.mi_grid_base + iVar16;
  (x->e_mbd).tx_type_map = (cpi->common).mi_params.tx_type_map + iVar16;
  (x->e_mbd).tx_type_map_stride = iVar5;
  x->mbmi_ext_frame =
       (cpi->mbmi_ext_info).frame_base + (iVar10 * (cpi->mbmi_ext_info).stride + iVar4);
  uVar11 = (uint)(uVar1 == '\0') * 2 + 1;
  local_260 = (ulong)uVar11;
  local_208 = &cpi->common;
  lVar19 = 0;
  local_258 = (MACROBLOCKD *)CONCAT44(local_258._4_4_,(int)CONCAT71(in_register_00000081,bsize));
  av1_setup_dst_planes
            ((x->e_mbd).plane,bsize,&((cpi->common).cur_frame)->buf,mi_row,mi_col,0,uVar11);
  iVar5 = (cpi->oxcf).border_in_pixels;
  iVar4 = (cpi->common).mi_params.mi_rows;
  iVar10 = (cpi->common).mi_params.mi_cols;
  iVar14 = 8 - (iVar5 + mi_row * 4);
  iVar16 = (mi_row + (uint)bVar12) * -4 + -8;
  if (iVar16 < iVar14) {
    iVar16 = iVar14;
  }
  iVar15 = iVar4 - mi_row;
  iVar14 = iVar15 * 4 + 8;
  iVar15 = iVar5 + (iVar15 - (uint)bVar12) * 4 + -8;
  if (iVar15 < iVar14) {
    iVar14 = iVar15;
  }
  (x->mv_limits).row_min = iVar16;
  (x->mv_limits).row_max = iVar14;
  iVar16 = (int)local_250;
  iVar15 = 8 - (iVar5 + iVar16 * 4);
  iVar14 = ((uint)bVar18 + iVar16) * -4 + -8;
  if (iVar14 < iVar15) {
    iVar14 = iVar15;
  }
  (x->mv_limits).col_min = iVar14;
  iVar15 = iVar10 - iVar16;
  iVar14 = iVar5 + (iVar15 - (uint)bVar18) * 4 + -8;
  iVar5 = iVar15 * 4 + 8;
  if (iVar14 < iVar5) {
    iVar5 = iVar14;
  }
  (x->mv_limits).col_max = iVar5;
  do {
    bVar9 = (byte)(((uint)bVar12 << 2) >>
                  (*(byte *)((long)(x->e_mbd).plane[0].pre + lVar19 + -0x28) & 0x1f));
    bVar17 = (byte)(((uint)bVar18 << 2) >>
                   (*(byte *)((long)(x->e_mbd).plane[0].pre + lVar19 + -0x2c) & 0x1f));
    if (bVar17 < 5) {
      bVar17 = 4;
    }
    *(byte *)((long)((x->e_mbd).plane[0].seg_iqmatrix + -1) + lVar19 + 0x90) = bVar17;
    if (bVar9 < 5) {
      bVar9 = 4;
    }
    *(byte *)((long)((x->e_mbd).plane[0].seg_iqmatrix + -1) + lVar19 + 0x91) = bVar9;
    lVar19 = lVar19 + 0xa30;
  } while (local_260 * 0xa30 - lVar19 != 0);
  (x->e_mbd).mi_row = mi_row;
  (x->e_mbd).mi_col = iVar16;
  (x->e_mbd).mb_to_top_edge = mi_row * -0x20;
  (x->e_mbd).mb_to_bottom_edge = (iVar4 - (mi_row + (uint)bVar12)) * 0x20;
  (x->e_mbd).mb_to_left_edge = iVar16 * -0x20;
  (x->e_mbd).mb_to_right_edge = (iVar10 - ((uint)bVar18 + iVar16)) * 0x20;
  BVar3 = (BLOCK_SIZE)local_258;
  uVar11 = (uint)(BLOCK_SIZE)local_258;
  local_220 = (ulong)(uint)mi_row;
  av1_setup_src_planes(x,cpi->source,mi_row,iVar16,(int)local_260,(BLOCK_SIZE)local_258);
  pMVar2 = *(x->e_mbd).mi;
  local_260 = CONCAT44(local_260._4_4_,uVar11);
  pMVar2->bsize = BVar3;
  pMVar2->ref_frame[0] = (char)local_238;
  pMVar2->ref_frame[1] = -1;
  pMVar2->motion_mode = '\0';
  (pMVar2->interp_filters).as_int = 0;
  bVar18 = (char)local_238 - 1;
  if ((bVar18 < 8) &&
     (lVar19 = (long)(cpi->common).remapped_ref_idx[((uint)local_238 & 0xff) - 1], lVar19 != -1)) {
    pRVar7 = (cpi->common).ref_frame_map[lVar19];
  }
  else {
    pRVar7 = (RefCntBuffer *)0x0;
  }
  local_258 = &x->e_mbd;
  pYVar13 = &pRVar7->buf;
  if (pRVar7 == (RefCntBuffer *)0x0) {
    pYVar13 = (YV12_BUFFER_CONFIG *)0x0;
  }
  local_240 = av1_get_scaled_ref_frame(cpi,(uint)local_238);
  local_244.row = 0;
  local_244.col = 0;
  iVar5 = (cpi->sf).part_sf.simple_motion_search_reduce_search_steps +
          (cpi->mv_search_params).mv_step_param;
  local_22c = 9;
  if (iVar5 < 9) {
    local_22c = iVar5;
  }
  if (bVar18 < 8) {
    iVar5 = (cpi->common).remapped_ref_idx[(byte)local_238 - 1];
    if (iVar5 == -1) goto LAB_00ba7362;
    psVar8 = (cpi->common).ref_scale_factors + iVar5;
  }
  else {
LAB_00ba7362:
    psVar8 = (scale_factors *)0x0;
  }
  av1_setup_pre_planes(local_258,0,pYVar13,mi_row,(int)local_250,psVar8,num_planes);
  bVar18 = pMVar2->ref_frame[0];
  bVar12 = pMVar2->ref_frame[1];
  if ((char)bVar18 < '\t') {
    bVar9 = 1;
    if ('\x01' < (char)bVar18) {
      bVar9 = bVar18;
    }
    iVar5 = (cpi->common).remapped_ref_idx[bVar9 - 1];
    if (iVar5 == -1) goto LAB_00ba73cd;
    psVar8 = (cpi->common).ref_scale_factors + iVar5;
  }
  else {
LAB_00ba73cd:
    psVar8 = (scale_factors *)0x0;
  }
  (x->e_mbd).block_ref_scale_factors[0] = psVar8;
  if ((char)bVar12 < '\t') {
    bVar18 = 1;
    if ('\x01' < (char)bVar12) {
      bVar18 = bVar12;
    }
    iVar5 = (cpi->common).remapped_ref_idx[bVar18 - 1];
    if (iVar5 != -1) {
      psVar8 = (cpi->common).ref_scale_factors + iVar5;
      goto LAB_00ba740d;
    }
  }
  psVar8 = (scale_factors *)0x0;
LAB_00ba740d:
  (x->e_mbd).block_ref_scale_factors[1] = psVar8;
  if (local_240 != (YV12_BUFFER_CONFIG *)0x0) {
    local_1f8 = (x->e_mbd).plane[0].pre[0].buf;
    puStack_1f0 = (x->e_mbd).plane[0].pre[0].buf0;
    local_1e8._0_4_ = (x->e_mbd).plane[0].pre[0].width;
    local_1e8._4_4_ = (x->e_mbd).plane[0].pre[0].height;
    uStack_1e0 = *(undefined8 *)&(x->e_mbd).plane[0].pre[0].stride;
    av1_setup_pre_planes
              (local_258,0,local_240,mi_row,(int)local_250,(scale_factors *)0x0,num_planes);
  }
  uVar11 = 0;
  if ((cpi->is_screen_content_type != 0) &&
     ((cpi->ppi->gf_group).update_type[cpi->gf_frame_index] == '\x03')) {
    uVar11 = (uint)((cpi->oxcf).speed < 3);
  }
  bVar18 = (cpi->sf).mv_sf.search_method;
  iVar5 = (cpi->sf).mv_sf.use_bsize_dependent_search_method;
  bVar12 = block_size_high[local_228];
  if (block_size_wide[local_228] < block_size_high[local_228]) {
    bVar12 = block_size_wide[local_228];
  }
  if ((iVar5 == 1 && 0x1f < bVar12) ||
     (((0xf < bVar12 && 1 < iVar5 && ((x->content_state_sb).source_sad_nonrd < kHighSad)) &&
      (x->qindex < 0xc0)))) {
    if (bVar18 < 0xb) {
      bVar18 = (&DAT_00daa680)[bVar18];
    }
    else {
      bVar18 = 0;
    }
  }
  iVar5 = (x->e_mbd).plane[0].pre[0].stride;
  if (iVar5 == (cpi->mv_search_params).search_site_cfg[0][0].stride) {
    search_sites = (cpi->mv_search_params).search_site_cfg[0];
  }
  else if (iVar5 == (cpi->mv_search_params).search_site_cfg[1][0].stride) {
    search_sites = (cpi->mv_search_params).search_site_cfg[1];
  }
  else {
    search_sites = x->search_site_cfg_buf;
    if (iVar5 != x->search_site_cfg_buf[""[bVar18]].stride) {
      (*av1_init_motion_compensation[""[""[bVar18]]])
                (search_sites + ""[""[bVar18]],iVar5,SUB14((bVar18 & 0xfe) == 2,0));
    }
  }
  av1_make_default_fullpel_ms_params
            (&local_1b8,cpi,x,(BLOCK_SIZE)local_260,&local_244,start_mv,search_sites,bVar18,uVar11);
  pYVar13 = local_240;
  if ((cpi->sf).mv_sf.subpel_search_method == '\0') {
    cost_list_00 = (int *)0x0;
  }
  else {
    cost_list_00 = local_1d8;
    if ((cpi->sf).mv_sf.use_fullpel_costlist == 0) {
      cost_list_00 = (int *)0x0;
    }
  }
  iVar5 = av1_full_pixel_search
                    (start_mv,&local_1b8,local_22c,cost_list_00,&local_264,&local_214,
                     (FULLPEL_MV *)0x0);
  if (iVar5 == 0x7fffffff) {
    bVar20 = false;
  }
  else {
    bVar20 = false;
    if ((use_subpixel != 0) &&
       (bVar20 = false, (cpi->common).features.cur_frame_force_integer_mv == false)) {
      bVar20 = (cpi->sf).mv_sf.simple_motion_subpel_force_stop != '\x03';
    }
  }
  if (pYVar13 != (YV12_BUFFER_CONFIG *)0x0) {
    (x->e_mbd).plane[0].pre[0].width = (undefined4)local_1e8;
    (x->e_mbd).plane[0].pre[0].height = local_1e8._4_4_;
    *(undefined8 *)&(x->e_mbd).plane[0].pre[0].stride = uStack_1e0;
    (x->e_mbd).plane[0].pre[0].buf = local_1f8;
    (x->e_mbd).plane[0].pre[0].buf0 = puStack_1f0;
  }
  if (bVar20) {
    local_1fc = 0;
    av1_make_default_subpel_ms_params(&local_d8,cpi,x,(BLOCK_SIZE)local_260,&local_244,local_1d8);
    cm = local_208;
    xd = local_258;
    local_d8.forced_stop = (cpi->sf).mv_sf.simple_motion_subpel_force_stop;
    (*(cpi->mv_search_params).find_fractional_mv_step)
              (local_258,local_208,&local_d8,
               (MV)(((uint)local_264 >> 0x10) * 0x80000 + ((uint)local_264 & 0x1fff) * 8),&local_214
               ,(MV *)&local_264,&local_1fc,x->pred_sse + (int)local_238,(int_mv *)0x0);
    pMVar2->mv[0].as_int = (uint32_t)local_264;
    av1_enc_build_inter_predictor
              (cm,xd,(int)local_220,(int)local_250,(BUFFER_SET *)0x0,(BLOCK_SIZE)local_260,0,0);
    uVar11 = (*cpi->ppi->fn_ptr[local_228].vf)
                       (x->plane[0].src.buf,x->plane[0].src.stride,(x->e_mbd).plane[0].dst.buf,
                        (x->e_mbd).plane[0].dst.stride,sse);
    *var = uVar11;
  }
  else {
    local_264 = (FULLPEL_MV)(((uint)local_264 >> 0x10) * 0x80000 + ((uint)local_264 & 0x1fff) * 8);
    *var = local_214.distortion;
    *sse = local_214.sse;
  }
  iVar6._0_2_ = local_264.row;
  iVar6._2_2_ = local_264.col;
  return (int_mv)iVar6.as_int;
}

Assistant:

int_mv av1_simple_motion_search_sse_var(AV1_COMP *const cpi, MACROBLOCK *x,
                                        int mi_row, int mi_col,
                                        BLOCK_SIZE bsize, int ref,
                                        FULLPEL_MV start_mv, int num_planes,
                                        int use_subpixel, unsigned int *sse,
                                        unsigned int *var) {
  assert(num_planes == 1 &&
         "Currently simple_motion_search only supports luma plane");
  assert(!frame_is_intra_only(&cpi->common) &&
         "Simple motion search only enabled for non-key frames");
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *xd = &x->e_mbd;

  set_offsets_for_motion_search(cpi, x, mi_row, mi_col, bsize);

  MB_MODE_INFO *mbmi = xd->mi[0];
  mbmi->bsize = bsize;
  mbmi->ref_frame[0] = ref;
  mbmi->ref_frame[1] = NONE_FRAME;
  mbmi->motion_mode = SIMPLE_TRANSLATION;
  mbmi->interp_filters = av1_broadcast_interp_filter(EIGHTTAP_REGULAR);

  const YV12_BUFFER_CONFIG *yv12 = get_ref_frame_yv12_buf(cm, ref);
  const YV12_BUFFER_CONFIG *scaled_ref_frame =
      av1_get_scaled_ref_frame(cpi, ref);
  struct buf_2d backup_yv12;
  // ref_mv is used to calculate the cost of the motion vector
  const MV ref_mv = kZeroMv;
  const int step_param =
      AOMMIN(cpi->mv_search_params.mv_step_param +
                 cpi->sf.part_sf.simple_motion_search_reduce_search_steps,
             MAX_MVSEARCH_STEPS - 2);
  int cost_list[5];
  const int ref_idx = 0;
  int bestsme;
  int_mv best_mv;
  FULLPEL_MV_STATS best_mv_stats;

  av1_setup_pre_planes(xd, ref_idx, yv12, mi_row, mi_col,
                       get_ref_scale_factors(cm, ref), num_planes);
  set_ref_ptrs(cm, xd, mbmi->ref_frame[0], mbmi->ref_frame[1]);
  if (scaled_ref_frame) {
    backup_yv12 = xd->plane[AOM_PLANE_Y].pre[ref_idx];
    av1_setup_pre_planes(xd, ref_idx, scaled_ref_frame, mi_row, mi_col, NULL,
                         num_planes);
  }

  // Allow more mesh searches for screen content type on the ARF.
  const int fine_search_interval = use_fine_search_interval(cpi);
  FULLPEL_MOTION_SEARCH_PARAMS full_ms_params;
  const MV_SPEED_FEATURES *mv_sf = &cpi->sf.mv_sf;
  const SEARCH_METHODS search_method =
      av1_get_default_mv_search_method(x, mv_sf, bsize);
  const search_site_config *src_search_sites =
      av1_get_search_site_config(cpi, x, search_method);
  av1_make_default_fullpel_ms_params(&full_ms_params, cpi, x, bsize, &ref_mv,
                                     start_mv, src_search_sites, search_method,
                                     fine_search_interval);

  bestsme = av1_full_pixel_search(start_mv, &full_ms_params, step_param,
                                  cond_cost_list(cpi, cost_list),
                                  &best_mv.as_fullmv, &best_mv_stats, NULL);

  const int use_subpel_search =
      bestsme < INT_MAX && !cpi->common.features.cur_frame_force_integer_mv &&
      use_subpixel &&
      (cpi->sf.mv_sf.simple_motion_subpel_force_stop != FULL_PEL);
  if (scaled_ref_frame) {
    xd->plane[AOM_PLANE_Y].pre[ref_idx] = backup_yv12;
  }
  if (use_subpel_search) {
    int not_used = 0;

    SUBPEL_MOTION_SEARCH_PARAMS ms_params;
    av1_make_default_subpel_ms_params(&ms_params, cpi, x, bsize, &ref_mv,
                                      cost_list);
    // TODO(yunqing): integrate this into av1_make_default_subpel_ms_params().
    ms_params.forced_stop = mv_sf->simple_motion_subpel_force_stop;

    MV subpel_start_mv = get_mv_from_fullmv(&best_mv.as_fullmv);
    assert(av1_is_subpelmv_in_range(&ms_params.mv_limits, subpel_start_mv));

    cpi->mv_search_params.find_fractional_mv_step(
        xd, cm, &ms_params, subpel_start_mv, &best_mv_stats, &best_mv.as_mv,
        &not_used, &x->pred_sse[ref], NULL);

    mbmi->mv[0] = best_mv;

    // Get a copy of the prediction output
    av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, NULL, bsize,
                                  AOM_PLANE_Y, AOM_PLANE_Y);
    *var = cpi->ppi->fn_ptr[bsize].vf(
        x->plane[0].src.buf, x->plane[0].src.stride, xd->plane[0].dst.buf,
        xd->plane[0].dst.stride, sse);
  } else {
    // Manually convert from units of pixel to 1/8-pixels if we are not doing
    // subpel search
    convert_fullmv_to_mv(&best_mv);
    *var = best_mv_stats.distortion;
    *sse = best_mv_stats.sse;
  }

  return best_mv;
}